

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executable.cpp
# Opt level: O2

bool fs_is_executable_binary(string_view path)

{
  long lVar1;
  bool bVar2;
  array<char,_4UL> magic;
  ifstream f;
  byte abStack_1f0 [488];
  
  std::ifstream::ifstream(&f,path._M_str,_S_bin);
  if ((abStack_1f0[*(long *)(_f + -0x18)] & 5) == 0) {
    lVar1 = std::istream::read((char *)&f,(long)&magic);
    lVar1 = *(long *)(lVar1 + 8);
    std::ifstream::~ifstream(&f);
    bVar2 = false;
    if ((((lVar1 == 4) && (magic._M_elems[0] == '\x7f')) && (magic._M_elems[1] == 'E')) &&
       (magic._M_elems[2] == 'L')) {
      bVar2 = magic._M_elems[3] == 'F';
    }
  }
  else {
    std::ifstream::~ifstream(&f);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool fs_is_executable_binary(std::string_view path)
{
  // is path a binary executable file as determined by the magic number
  // beginning the file.  This is a heuristic and may not be 100% accurate.
  bool ok = false;
#if defined(_WIN32)
  // MinGW, MSVC, oneAPI at least need || is_appexec_alias()
  DWORD t;
  ok = (GetBinaryTypeA(path.data(), &t) != 0) || fs_is_appexec_alias(path);
#else
  // https://github.com/jart/cosmopolitan/blob/master/ape/specification.md

  std::array<char, 4> magic;

  if(std::ifstream f{path.data(), std::ios::binary}){
    if(f.read(magic.data(), 4).gcount() != 4)
      return false;
  } else
    return false;

#if defined(__APPLE__)
  // https://ss64.com/mac/file.html
    // Mach-O magic numbers
    // https://stackoverflow.com/q/27669766
    // https://jonasdevlieghere.com/post/macho-4gb-limit/
    // MH_MAGIC: 0xfeedface (32-bit)
    // MH_MAGIC_64: 0xfeedfacf (64-bit)
    // FAT_MAGIC: 0xCAFEBABE (32-bit)
    // FAT_MAGIC_64: 0xCAFEBABF (64-bit)
    // it's necessary to consider the reversed magic number for each of these as well,
    // done in the "*CIGAM*" constants

  std::uint32_t um32;
  std::memcpy(&um32, magic.data(), sizeof(um32));

  ok = um32 == MH_MAGIC ||  um32 == MH_MAGIC_64 ||
       um32 == MH_CIGAM ||  um32 == MH_CIGAM_64 ||
       um32 == FAT_MAGIC || um32 == FAT_MAGIC_64 ||
       um32 == FAT_CIGAM || um32 == FAT_CIGAM_64;

#else
  // Linux / BSD: executable binary check via ELF file magic number
    ok = magic[0] == 0x7f && magic[1] == 'E' && magic[2] == 'L' && magic[3] == 'F';
  // does not consider PE or COFF formats.
#endif
#endif

  return ok;
}